

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O2

pair<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>,_bool>
* __thiscall
pstore::json::details::whitespace_matcher<pstore::exchange::import_ns::callbacks>::consume
          (pair<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>,_bool>
           *__return_storage_ptr__,whitespace_matcher<pstore::exchange::import_ns::callbacks> *this,
          parser<pstore::exchange::import_ns::callbacks> *parser,maybe<char,_void> *ch)

{
  char c;
  int iVar1;
  char *pcVar2;
  
  if (ch->valid_ == false) {
    (this->super_matcher<pstore::exchange::import_ns::callbacks>).state_ = 1;
    goto LAB_001170ef;
  }
  pcVar2 = maybe<char,_void>::operator->(ch);
  iVar1 = (this->super_matcher<pstore::exchange::import_ns::callbacks>).state_;
  if (7 < iVar1 - 1U) goto LAB_001170ef;
  c = *pcVar2;
  switch(iVar1) {
  case 1:
    assert_failed("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/json/json.hpp"
                  ,0x5b6);
  case 2:
switchD_001170c1_caseD_2:
    consume_body(__return_storage_ptr__,this,parser,c);
    return __return_storage_ptr__;
  case 3:
    (this->super_matcher<pstore::exchange::import_ns::callbacks>).state_ = 2;
    if (c != '\n') goto switchD_001170c1_caseD_2;
    break;
  case 4:
    if ((parser->extensions_ & (multi_line_comments|single_line_comments|bash_comments)) == none) {
      assert_failed("parser.extension_enabled (extensions::bash_comments) || parser.extension_enabled (extensions::single_line_comments) || parser.extension_enabled (extensions::multi_line_comments)"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/json/json.hpp"
                    ,0x5ac);
    }
    if ((c == '\r') || (c == '\n')) {
      (this->super_matcher<pstore::exchange::import_ns::callbacks>).state_ = 2;
      *(undefined8 *)
       &(__return_storage_ptr__->first)._M_t.
        super___uniq_ptr_impl<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_*,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>
           = 1;
      (__return_storage_ptr__->first)._M_t.
      super___uniq_ptr_impl<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_*,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>
      .
      super__Head_base<0UL,_pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_*,_false>
      ._M_head_impl = (matcher<pstore::exchange::import_ns::callbacks> *)0x0;
      __return_storage_ptr__->second = false;
      return __return_storage_ptr__;
    }
    goto LAB_001170ef;
  case 5:
    consume_comment_start(__return_storage_ptr__,this,parser,c);
    return __return_storage_ptr__;
  case 6:
switchD_001170c1_caseD_6:
    multi_line_comment_body(__return_storage_ptr__,this,parser,c);
    return __return_storage_ptr__;
  case 7:
    if ((parser->extensions_ & multi_line_comments) == none) {
      assert_failed("parser.extension_enabled (extensions::multi_line_comments)",
                    "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/json/json.hpp"
                    ,0x59a);
    }
    (this->super_matcher<pstore::exchange::import_ns::callbacks>).state_ = (uint)(c != '/') * 4 + 2;
    goto LAB_001170ef;
  case 8:
    (this->super_matcher<pstore::exchange::import_ns::callbacks>).state_ = 6;
    if (c != '\n') goto switchD_001170c1_caseD_6;
  }
  (parser->coordinate_).column = 0;
LAB_001170ef:
  *(undefined8 *)
   &(__return_storage_ptr__->first)._M_t.
    super___uniq_ptr_impl<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_*,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>
       = 1;
  (__return_storage_ptr__->first)._M_t.
  super___uniq_ptr_impl<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_*,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>
  .
  super__Head_base<0UL,_pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_*,_false>
  ._M_head_impl = (matcher<pstore::exchange::import_ns::callbacks> *)0x0;
  __return_storage_ptr__->second = true;
  return __return_storage_ptr__;
}

Assistant:

std::pair<typename matcher<Callbacks>::pointer, bool>
            whitespace_matcher<Callbacks>::consume (parser<Callbacks> & parser, maybe<char> ch) {
                if (!ch) {
                    this->set_state (done_state);
                } else {
                    char const c = *ch;
                    switch (this->get_state ()) {
                    // Handles the LF part of a Windows-style CR/LF pair.
                    case crlf_state:
                        this->set_state (body_state);
                        if (crlf (parser, c)) {
                            break;
                        }
                        PSTORE_FALLTHROUGH;
                    case body_state: return this->consume_body (parser, c);
                    case comment_start_state: return this->consume_comment_start (parser, c);

                    case multi_line_comment_ending_state:
                        PSTORE_ASSERT (parser.extension_enabled (extensions::multi_line_comments));
                        this->set_state (c == details::char_set::slash
                                             ? body_state
                                             : multi_line_comment_body_state);
                        break;

                    case multi_line_comment_crlf_state:
                        this->set_state (multi_line_comment_body_state);
                        if (crlf (parser, c)) {
                            break;
                        }
                        PSTORE_FALLTHROUGH;
                    case multi_line_comment_body_state:
                        return this->multi_line_comment_body (parser, c);
                    case single_line_comment_state:
                        PSTORE_ASSERT (
                            parser.extension_enabled (extensions::bash_comments) ||
                            parser.extension_enabled (extensions::single_line_comments) ||
                            parser.extension_enabled (extensions::multi_line_comments));
                        if (c == details::char_set::cr || c == details::char_set::lf) {
                            // This character marks a bash/single-line comment end. Go back to
                            // normal whitespace handling. Retry with the same character.
                            this->set_state (body_state);
                            return {nullptr, false};
                        }
                        // Just consume the character.
                        break;

                    case done_state: PSTORE_ASSERT (false); break;
                    }
                }
                return {nullptr, true};
            }